

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O0

void __thiscall PieceSquareTableBase::InvertColor(PieceSquareTableBase *this)

{
  value_type vVar1;
  reference pvVar2;
  uint local_118;
  uint local_114;
  uint j;
  uint i;
  PieceSquareRawTableType temp;
  PieceSquareTableBase *this_local;
  
  temp._M_elems._248_8_ = this;
  memcpy(&j,&this->m_SourceTable,0x100);
  for (local_114 = 0; local_114 < 8; local_114 = local_114 + 1) {
    for (local_118 = 0; local_118 < 8; local_118 = local_118 + 1) {
      pvVar2 = std::array<int,_64UL>::operator[]
                         ((array<int,_64UL> *)&j,(ulong)(local_114 + (7 - local_118) * 8));
      vVar1 = *pvVar2;
      pvVar2 = std::array<int,_64UL>::operator[]
                         (&this->m_SourceTable,(ulong)(local_114 + local_118 * 8));
      *pvVar2 = vVar1;
    }
  }
  return;
}

Assistant:

virtual void InvertColor()
    {
        PieceSquareRawTableType temp;
        temp = m_SourceTable;
        for ( unsigned int i = 0; i < MAX_FILES; i++ )
            for ( unsigned int j = 0; j < MAX_FILES; j++ )
            {
                m_SourceTable[ i + j * MAX_FILES ] =
                    temp[ i + ( ( MAX_FILES - 1 ) - j ) * MAX_FILES];
            }
    }